

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_swap_tests.cpp
# Opt level: O1

void check_swap(json *j1,json *j2)

{
  int iVar1;
  json j3;
  json j4;
  AssertionHandler catchAssertionHandler;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bStack_f8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_e8;
  SourceLineInfo local_d8;
  AssertionHandler local_c8;
  ITransientExpression local_80;
  json *local_70;
  char *local_68;
  size_t sStack_60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_58;
  StringRef local_50;
  StringRef local_40;
  
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&bStack_f8,j1);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&local_e8,j2);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::swap
            (&bStack_f8,&local_e8);
  local_80._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_80.m_isBinaryExpression = true;
  local_80.m_result = false;
  local_80._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
  ;
  local_d8.line = 0x15;
  Catch::StringRef::StringRef(&local_40,"j1 == j4");
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,(StringRef *)&local_80,&local_d8,local_40,ContinueOnFailure);
  iVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (j1,&local_e8);
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_80.m_result = iVar1 == 0;
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59c50;
  local_68 = local_d8.file;
  sStack_60 = local_d8.line;
  local_70 = j1;
  local_58 = &local_e8;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_80._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_80.m_isBinaryExpression = true;
  local_80.m_result = false;
  local_80._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/json_swap_tests.cpp"
  ;
  local_d8.line = 0x16;
  Catch::StringRef::StringRef(&local_50,"j2 == j3");
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,(StringRef *)&local_80,&local_d8,local_50,ContinueOnFailure);
  iVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (j2,&bStack_f8);
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_80.m_result = iVar1 == 0;
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59c50;
  local_68 = local_d8.file;
  sStack_60 = local_d8.line;
  local_70 = j2;
  local_58 = &bStack_f8;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_e8);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&bStack_f8);
  return;
}

Assistant:

void check_swap(const json& j1, const json& j2)
{
    json j3 = j1;
    json j4 = j2;

    j3.swap(j4);
    CHECK(j1 == j4);
    CHECK(j2 == j3);
}